

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O1

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  iterator __position;
  long *plVar1;
  auto_ptr<cmVariableWatch::Pair> aVar2;
  vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *this_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  auto_ptr<cmVariableWatch::Pair> p;
  auto_ptr<cmVariableWatch::Pair> local_38;
  Pair *local_30;
  
  local_38.x_ = (Pair *)operator_new(0x18);
  (local_38.x_)->Method = (WatchMethod)0x0;
  (local_38.x_)->ClientData = (void *)0x0;
  (local_38.x_)->DeleteDataCall = (DeleteData)0x0;
  (local_38.x_)->Method = method;
  (local_38.x_)->ClientData = client_data;
  (local_38.x_)->DeleteDataCall = delete_data;
  this_00 = (vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
            ::operator[](&this->WatchMap,variable);
  aVar2.x_ = local_38.x_;
  __position._M_current = *(Pair ***)(this_00 + 8);
  lVar3 = (long)__position._M_current - *(long *)this_00;
  bVar6 = lVar3 == 0;
  if (!bVar6) {
    uVar4 = lVar3 >> 3;
    uVar5 = 1;
    do {
      if (((client_data != (void *)0x0) &&
          (plVar1 = *(long **)(*(long *)this_00 + -8 + uVar5 * 8), (WatchMethod)*plVar1 == method))
         && ((void *)plVar1[1] == client_data)) goto LAB_002cd602;
      bVar6 = uVar4 <= uVar5;
      lVar3 = (-(ulong)(uVar4 == 0) - uVar4) + uVar5;
      uVar5 = uVar5 + 1;
    } while (lVar3 != 0);
  }
  local_38.x_ = (Pair *)0x0;
  local_30 = aVar2.x_;
  if (__position._M_current == *(Pair ***)(this_00 + 0x10)) {
    std::vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>>::
    _M_realloc_insert<cmVariableWatch::Pair*>(this_00,__position,&local_30);
  }
  else {
    *__position._M_current = aVar2.x_;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
LAB_002cd602:
  ::cm::auto_ptr<cmVariableWatch::Pair>::~auto_ptr(&local_38);
  return bVar6;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  CM_AUTO_PTR<cmVariableWatch::Pair> p(new cmVariableWatch::Pair);
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for (cc = 0; cc < vp->size(); cc++) {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp->push_back(p.release());
  return true;
}